

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_analyzer.cc
# Opt level: O1

void __thiscall
sptk::reaper::LpcAnalyzer::HannWindow(LpcAnalyzer *this,float *din,float *dout,int n,float preemp)

{
  vector<float,_std::allocator<float>_> *this_00;
  pointer pfVar1;
  double dVar2;
  ulong uVar3;
  
  this_00 = &this->window_;
  if (((long)(this->window_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->window_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start >> 2 != (long)n) &&
     (std::vector<float,_std::allocator<float>_>::resize(this_00,(long)n), 0 < n)) {
    uVar3 = 0;
    do {
      dVar2 = cos(((double)(int)uVar3 + 0.5) * (6.283185307179586 / (double)n));
      (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar3] = (float)(dVar2 * -0.5 + 0.5);
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  if ((preemp != 0.0) || (NAN(preemp))) {
    if (0 < n) {
      pfVar1 = (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = 0;
      do {
        dout[uVar3] = (din[uVar3] * -preemp + din[uVar3 + 1]) * pfVar1[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uint)n != uVar3);
    }
  }
  else if (0 < n) {
    pfVar1 = (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = 0;
    do {
      dout[uVar3] = pfVar1[uVar3] * din[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  return;
}

Assistant:

void LpcAnalyzer::HannWindow(const float* din, float* dout, int n,
                             float preemp) {
  int i;
  const float *p;

  // Need to create a new Hanning window? */
  if (window_.size() != static_cast<size_t>(n)) {
    double arg, half = 0.5;
    window_.resize(n);
    for (i = 0, arg = M_PI * 2.0 / n; i < n; ++i)
      window_[i] = (half - half * cos((half + i) * arg));
  }
  /* If preemphasis is to be performed,  this assumes that there are n+1 valid
     samples in the input buffer (din). */
  if (preemp != 0.0) {
    for (i = 0, p = din + 1; i < n; ++i)
      *dout++ = window_[i] * (*p++ - (preemp * *din++));
  } else {
    for (i = 0; i < n; ++i)
      *dout++ = window_[i] * *din++;
  }
}